

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppgenerator.cpp
# Opt level: O2

void __thiscall CppGenerator::generateDecl(CppGenerator *this,QTextStream *out)

{
  Grammar *pGVar1;
  bool bVar2;
  QTextStream *pQVar3;
  ptrdiff_t pVar4;
  _Base_ptr p_Var5;
  char *pcVar6;
  long lVar7;
  long in_FS_OFFSET;
  QLatin1String QVar9;
  QLatin1StringView local_68;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  qsizetype qVar8;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = (QTextStream *)QTextStream::operator<<(out,"class ");
  pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,(QString *)&this->grammar->table_name);
  pQVar3 = (QTextStream *)Qt::endl(pQVar3);
  pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,"{");
  pQVar3 = (QTextStream *)Qt::endl(pQVar3);
  pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,"public:");
  pQVar3 = (QTextStream *)Qt::endl(pQVar3);
  pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,"    enum VariousConstants {");
  Qt::endl(pQVar3);
  pGVar1 = this->grammar;
  p_Var5 = (pGVar1->terminals)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var5 == &(pGVar1->terminals)._M_t._M_impl.super__Rb_tree_header) {
      pQVar3 = (QTextStream *)Qt::endl(out);
      pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,"        ACCEPT_STATE = ");
      pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,this->accept_state);
      pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,",");
      pQVar3 = (QTextStream *)Qt::endl(pQVar3);
      pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,"        RULE_COUNT = ");
      pQVar3 = (QTextStream *)
               QTextStream::operator<<
                         (pQVar3,(this->grammar->rules).
                                 super__List_base<Rule,_std::allocator<Rule>_>._M_impl._M_node.
                                 _M_size);
      pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,",");
      pQVar3 = (QTextStream *)Qt::endl(pQVar3);
      pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,"        STATE_COUNT = ");
      pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,this->state_count);
      pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,",");
      pQVar3 = (QTextStream *)Qt::endl(pQVar3);
      pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,"        TERMINAL_COUNT = ");
      pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,this->terminal_count);
      pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,",");
      pQVar3 = (QTextStream *)Qt::endl(pQVar3);
      pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,"        NON_TERMINAL_COUNT = ");
      pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,this->non_terminal_count);
      pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,",");
      pQVar3 = (QTextStream *)Qt::endl(pQVar3);
      pQVar3 = (QTextStream *)Qt::endl(pQVar3);
      pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,"        GOTO_INDEX_OFFSET = ");
      pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,(this->compressed_action).index.d.size)
      ;
      pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,",");
      pQVar3 = (QTextStream *)Qt::endl(pQVar3);
      pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,"        GOTO_INFO_OFFSET = ");
      pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,(this->compressed_action).info.d.size);
      pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,",");
      pQVar3 = (QTextStream *)Qt::endl(pQVar3);
      pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,"        GOTO_CHECK_OFFSET = ");
      pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,(this->compressed_action).check.d.size)
      ;
      pQVar3 = (QTextStream *)Qt::endl(pQVar3);
      pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,"    };");
      pQVar3 = (QTextStream *)Qt::endl(pQVar3);
      pQVar3 = (QTextStream *)Qt::endl(pQVar3);
      pQVar3 = (QTextStream *)
               QTextStream::operator<<(pQVar3,"    static const char *const     spell[];");
      pQVar3 = (QTextStream *)Qt::endl(pQVar3);
      pQVar3 = (QTextStream *)
               QTextStream::operator<<(pQVar3,"    static const short             lhs[];");
      pQVar3 = (QTextStream *)Qt::endl(pQVar3);
      pQVar3 = (QTextStream *)
               QTextStream::operator<<(pQVar3,"    static const short             rhs[];");
      Qt::endl(pQVar3);
      if (this->debug_info != false) {
        local_58.size = -0x5555555555555556;
        local_58.d = (Data *)0xaaaaaaaaaaaaaaaa;
        local_58.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
        debugInfoProt((QString *)&local_58,this);
        pQVar3 = (QTextStream *)Qt::endl(out);
        pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,"#ifndef ");
        pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,(QString *)&local_58);
        pQVar3 = (QTextStream *)Qt::endl(pQVar3);
        pQVar3 = (QTextStream *)
                 QTextStream::operator<<(pQVar3,"    static const int     rule_index[];");
        pQVar3 = (QTextStream *)Qt::endl(pQVar3);
        pQVar3 = (QTextStream *)
                 QTextStream::operator<<(pQVar3,"    static const int      rule_info[];");
        pQVar3 = (QTextStream *)Qt::endl(pQVar3);
        pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,"#endif // ");
        pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,(QString *)&local_58);
        pQVar3 = (QTextStream *)Qt::endl(pQVar3);
        Qt::endl(pQVar3);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      }
      pQVar3 = (QTextStream *)
               QTextStream::operator<<(out,"    static const short    goto_default[];");
      pQVar3 = (QTextStream *)Qt::endl(pQVar3);
      pQVar3 = (QTextStream *)
               QTextStream::operator<<(pQVar3,"    static const short  action_default[];");
      pQVar3 = (QTextStream *)Qt::endl(pQVar3);
      pQVar3 = (QTextStream *)
               QTextStream::operator<<(pQVar3,"    static const short    action_index[];");
      pQVar3 = (QTextStream *)Qt::endl(pQVar3);
      pQVar3 = (QTextStream *)
               QTextStream::operator<<(pQVar3,"    static const short     action_info[];");
      pQVar3 = (QTextStream *)Qt::endl(pQVar3);
      pQVar3 = (QTextStream *)
               QTextStream::operator<<(pQVar3,"    static const short    action_check[];");
      pQVar3 = (QTextStream *)Qt::endl(pQVar3);
      pQVar3 = (QTextStream *)Qt::endl(pQVar3);
      pQVar3 = (QTextStream *)
               QTextStream::operator<<(pQVar3,"    static inline int nt_action (int state, int nt)")
      ;
      pQVar3 = (QTextStream *)Qt::endl(pQVar3);
      pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,"    {");
      pQVar3 = (QTextStream *)Qt::endl(pQVar3);
      pQVar3 = (QTextStream *)
               QTextStream::operator<<
                         (pQVar3,
                          "        const int yyn = action_index [GOTO_INDEX_OFFSET + state] + nt;");
      pQVar3 = (QTextStream *)Qt::endl(pQVar3);
      pQVar3 = (QTextStream *)
               QTextStream::operator<<
                         (pQVar3,
                          "        if (yyn < 0 || action_check [GOTO_CHECK_OFFSET + yyn] != nt)");
      pQVar3 = (QTextStream *)Qt::endl(pQVar3);
      pQVar3 = (QTextStream *)
               QTextStream::operator<<(pQVar3,"            return goto_default [nt];");
      pQVar3 = (QTextStream *)Qt::endl(pQVar3);
      pQVar3 = (QTextStream *)Qt::endl(pQVar3);
      pQVar3 = (QTextStream *)
               QTextStream::operator<<
                         (pQVar3,"        return action_info [GOTO_INFO_OFFSET + yyn];");
      pQVar3 = (QTextStream *)Qt::endl(pQVar3);
      pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,"    }");
      pQVar3 = (QTextStream *)Qt::endl(pQVar3);
      pQVar3 = (QTextStream *)Qt::endl(pQVar3);
      pQVar3 = (QTextStream *)
               QTextStream::operator<<
                         (pQVar3,"    static inline int t_action (int state, int token)");
      pQVar3 = (QTextStream *)Qt::endl(pQVar3);
      pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,"    {");
      pQVar3 = (QTextStream *)Qt::endl(pQVar3);
      pQVar3 = (QTextStream *)
               QTextStream::operator<<
                         (pQVar3,"        const int yyn = action_index [state] + token;");
      pQVar3 = (QTextStream *)Qt::endl(pQVar3);
      pQVar3 = (QTextStream *)Qt::endl(pQVar3);
      pQVar3 = (QTextStream *)
               QTextStream::operator<<(pQVar3,"        if (yyn < 0 || action_check [yyn] != token)")
      ;
      pQVar3 = (QTextStream *)Qt::endl(pQVar3);
      pQVar3 = (QTextStream *)
               QTextStream::operator<<(pQVar3,"            return - action_default [state];");
      pQVar3 = (QTextStream *)Qt::endl(pQVar3);
      pQVar3 = (QTextStream *)Qt::endl(pQVar3);
      pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,"        return action_info [yyn];");
      pQVar3 = (QTextStream *)Qt::endl(pQVar3);
      pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,"    }");
      pQVar3 = (QTextStream *)Qt::endl(pQVar3);
      pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,"};");
      pQVar3 = (QTextStream *)Qt::endl(pQVar3);
      pQVar3 = (QTextStream *)Qt::endl(pQVar3);
      Qt::endl(pQVar3);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      __stack_chk_fail();
    }
    lVar7 = *(long *)(p_Var5 + 1);
    local_58.d = *(Data **)(lVar7 + 0x10);
    local_58.ptr = *(char16_t **)(lVar7 + 0x18);
    local_58.size = *(qsizetype *)(lVar7 + 0x20);
    if (local_58.d != (Data *)0x0) {
      LOCK();
      ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      lVar7 = *(long *)(p_Var5 + 1);
    }
    pVar4 = std::__distance<QString>
                      ((this->grammar->names).super__List_base<QString,_std::allocator<QString>_>.
                       _M_impl._M_node.super__List_node_base._M_next,lVar7);
    local_68.m_size = 4;
    local_68.m_data = "$end";
    bVar2 = operator==((QString *)&local_58,&local_68);
    if (bVar2) {
      qVar8 = 10;
      pcVar6 = "EOF_SYMBOL";
LAB_001072d3:
      QVar9.m_data = pcVar6;
      QVar9.m_size = qVar8;
      QString::operator=((QString *)&local_58,QVar9);
    }
    else {
      local_68.m_size = 7;
      local_68.m_data = "$accept";
      bVar2 = operator==((QString *)&local_58,&local_68);
      if (bVar2) {
        qVar8 = 0xd;
        pcVar6 = "ACCEPT_SYMBOL";
        goto LAB_001072d3;
      }
      QString::prepend((QString *)&local_58,&this->grammar->token_prefix);
    }
    pQVar3 = (QTextStream *)QTextStream::operator<<(out,"        ");
    pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,(QString *)&local_58);
    pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3," = ");
    pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,(int)pVar4);
    pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,",");
    Qt::endl(pQVar3);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
  } while( true );
}

Assistant:

void CppGenerator::generateDecl (QTextStream &out)
{
  out << "class " << grammar.table_name << Qt::endl
      << "{" << Qt::endl
      << "public:" << Qt::endl
      << "    enum VariousConstants {" << Qt::endl;

  for (const Name &t : std::as_const(grammar.terminals))
    {
      QString name = *t;
      int value = std::distance (grammar.names.begin (), t);

      if (name == "$end"_L1)
        name = "EOF_SYMBOL"_L1;

      else if (name == "$accept"_L1)
        name = "ACCEPT_SYMBOL"_L1;

      else
        name.prepend (grammar.token_prefix);

      out << "        " << name << " = " << value << "," << Qt::endl;
    }

  out << Qt::endl
      << "        ACCEPT_STATE = " << accept_state << "," << Qt::endl
      << "        RULE_COUNT = " << grammar.rules.size () << "," << Qt::endl
      << "        STATE_COUNT = " << state_count << "," << Qt::endl
      << "        TERMINAL_COUNT = " << terminal_count << "," << Qt::endl
      << "        NON_TERMINAL_COUNT = " << non_terminal_count << "," << Qt::endl
      << Qt::endl
      << "        GOTO_INDEX_OFFSET = " << compressed_action.index.size () << "," << Qt::endl
      << "        GOTO_INFO_OFFSET = " << compressed_action.info.size () << "," << Qt::endl
      << "        GOTO_CHECK_OFFSET = " << compressed_action.check.size () << Qt::endl
      << "    };" << Qt::endl
      << Qt::endl
      << "    static const char *const     spell[];" << Qt::endl
      << "    static const short             lhs[];" << Qt::endl
      << "    static const short             rhs[];" << Qt::endl;

  if (debug_info)
    {
      QString prot = debugInfoProt();

      out << Qt::endl << "#ifndef " << prot << Qt::endl
          << "    static const int     rule_index[];" << Qt::endl
          << "    static const int      rule_info[];" << Qt::endl
          << "#endif // " << prot << Qt::endl << Qt::endl;
    }

  out << "    static const short    goto_default[];" << Qt::endl
      << "    static const short  action_default[];" << Qt::endl
      << "    static const short    action_index[];" << Qt::endl
      << "    static const short     action_info[];" << Qt::endl
      << "    static const short    action_check[];" << Qt::endl
      << Qt::endl
      << "    static inline int nt_action (int state, int nt)" << Qt::endl
      << "    {" << Qt::endl
      << "        const int yyn = action_index [GOTO_INDEX_OFFSET + state] + nt;" << Qt::endl
      << "        if (yyn < 0 || action_check [GOTO_CHECK_OFFSET + yyn] != nt)" << Qt::endl
      << "            return goto_default [nt];" << Qt::endl
      << Qt::endl
      << "        return action_info [GOTO_INFO_OFFSET + yyn];" << Qt::endl
      << "    }" << Qt::endl
      << Qt::endl
      << "    static inline int t_action (int state, int token)" << Qt::endl
      << "    {" << Qt::endl
      << "        const int yyn = action_index [state] + token;" << Qt::endl
      << Qt::endl
      << "        if (yyn < 0 || action_check [yyn] != token)" << Qt::endl
      << "            return - action_default [state];" << Qt::endl
      << Qt::endl
      << "        return action_info [yyn];" << Qt::endl
      << "    }" << Qt::endl
      << "};" << Qt::endl
      << Qt::endl
      << Qt::endl;
}